

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O2

double __thiscall
TasGrid::RuleWavelet::linear_boundary_wavelet<0>(RuleWavelet *this,double x,bool right)

{
  bool bVar1;
  double dVar2;
  
  dVar2 = 0.0;
  if (ABS(x + 0.5) <= 0.5) {
    if (-0.75 <= x) {
      bVar1 = -0.5 < x;
      if (right) {
        bVar1 = -0.5 <= x;
      }
      if (bVar1) {
        dVar2 = 0.0;
        bVar1 = 0.0 < x;
        if (right) {
          bVar1 = 0.0 <= x;
        }
        if (!bVar1) {
          dVar2 = x * 0.25;
        }
      }
      else {
        dVar2 = (x * 11.0 + 6.0) * -0.25;
      }
    }
    else {
      dVar2 = (x * 7.0 + 6.0) * 0.75;
    }
  }
  return dVar2;
}

Assistant:

inline double RuleWavelet::linear_boundary_wavelet(double x, bool right) const{
    // Evaluates or differentiates the first order boundary wavelet with support on [-1, 0].
    // If `right` is true, then we return the right derivatives/values (if they exist); else, we return the left ones.
    if (std::abs(x + 0.5) > 0.5) return 0.0;

    if (mode == 0) {
        if (x < -0.75) {
            return 0.75 * (7.0 * x + 6.0);
        } else if ((right and x < -0.5) or (!right and x <= -0.5)) {
             return -0.25 * (11.0 * x + 6.0);
        } else if ((right and x < 0) or (!right and x <= 0)) {
            return 0.25 * x;
        } else {
            return 0.0;
        }
    } else {
        if (x < -0.75 or (x == -0.75 and not right)) {
            return 0.75 * 7.0;
        } else if (x < -0.5 or (x == -0.5 and not right)) {
            return -0.25 * 11.0;
        } else if (x < 0 or (x == 0 and not right)) {
            return 0.25;
        } else {
            // Case: (right and x == 0.0)
            return 0.0;
        }
    }
}